

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceComponentsOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *interface_var_users,NestedCompositeComponents *scalar_interface_vars,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_composites)

{
  pointer ppIVar1;
  pointer ppIVar2;
  bool bVar3;
  pointer ppIVar4;
  
  if ((scalar_interface_vars->nested_composite_components).
      super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (scalar_interface_vars->nested_composite_components).
      super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = ReplaceMultipleComponentsOfInterfaceVarWith
                      (this,interface_var,interface_var_users,
                       &scalar_interface_vars->nested_composite_components,
                       interface_var_component_indices,extra_array_index,loads_to_composites,
                       loads_for_access_chain_to_composites);
    return bVar3;
  }
  ppIVar1 = (interface_var_users->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (interface_var_users->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar1 == ppIVar2) {
    bVar3 = true;
  }
  else {
    do {
      ppIVar4 = ppIVar1 + 1;
      bVar3 = ReplaceComponentOfInterfaceVarWith
                        (this,interface_var,*ppIVar1,scalar_interface_vars->component_variable,
                         interface_var_component_indices,extra_array_index,loads_to_composites,
                         loads_for_access_chain_to_composites);
      if (!bVar3) {
        return bVar3;
      }
      ppIVar1 = ppIVar4;
    } while (ppIVar4 != ppIVar2);
  }
  return bVar3;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceComponentsOfInterfaceVarWith(
    Instruction* interface_var,
    const std::vector<Instruction*>& interface_var_users,
    const NestedCompositeComponents& scalar_interface_vars,
    std::vector<uint32_t>& interface_var_component_indices,
    const uint32_t* extra_array_index,
    std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
    std::unordered_map<Instruction*, Instruction*>*
        loads_for_access_chain_to_composites) {
  if (!scalar_interface_vars.HasMultipleComponents()) {
    for (Instruction* interface_var_user : interface_var_users) {
      if (!ReplaceComponentOfInterfaceVarWith(
              interface_var, interface_var_user,
              scalar_interface_vars.GetComponentVariable(),
              interface_var_component_indices, extra_array_index,
              loads_to_composites, loads_for_access_chain_to_composites)) {
        return false;
      }
    }
    return true;
  }
  return ReplaceMultipleComponentsOfInterfaceVarWith(
      interface_var, interface_var_users, scalar_interface_vars.GetComponents(),
      interface_var_component_indices, extra_array_index, loads_to_composites,
      loads_for_access_chain_to_composites);
}